

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O3

void __thiscall amrex::ForkJoin::create_task_output_dir(ForkJoin *this)

{
  string *filename;
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  Print local_1a0;
  
  filename = &this->task_output_dir;
  iVar2 = std::__cxx11::string::compare((char *)filename);
  if (iVar2 != 0) {
    bVar1 = FileExists(filename);
    if (!bVar1) {
      if (this->flag_verbose == true) {
        local_1a0.os = OutStream();
        local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
        this_00 = &local_1a0.ss;
        local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
             *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Creating task_output_dir: ",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(this->task_output_dir)._M_dataplus._M_p,
                   (this->task_output_dir)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)this_00);
        std::ostream::put((char)this_00);
        std::ostream::flush();
        Print::~Print(&local_1a0);
      }
      if (*(int *)(DAT_00816950 + -0x3c) == *(int *)(DAT_00816950 + -0x30)) {
        UtilCreateDirectory((amrex *)filename,(string *)0x1ed,(uint)this->flag_verbose,
                            SUB41(*(int *)(DAT_00816950 + -0x3c),0));
      }
    }
  }
  return;
}

Assistant:

void ForkJoin::create_task_output_dir ()
{
    if (task_output_dir != "" && !amrex::FileExists(task_output_dir)) {
        if (flag_verbose) {
            Print() << "Creating task_output_dir: " << task_output_dir << std::endl;
        }
        if (ParallelContext::IOProcessorSub()) {
            amrex::UtilCreateDirectory(task_output_dir, 0755, flag_verbose);
        }
    }
}